

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::
SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
::reserve(SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
          *this,size_t count)

{
  ulong uVar1;
  AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
  *pAVar2;
  unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
  *puVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  if (count >> 0x3d == 0) {
    uVar1 = this->buffer_capacity;
    if (uVar1 < count) {
      uVar5 = 8;
      if (8 < uVar1) {
        uVar5 = uVar1;
      }
      do {
        uVar1 = uVar5;
        uVar5 = uVar1 * 2;
      } while (uVar1 < count);
      if (uVar1 < 9) {
        pAVar2 = &this->stack_storage;
      }
      else {
        pAVar2 = (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
                  *)malloc(uVar1 * 8);
        if (pAVar2 == (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
                       *)0x0) goto LAB_002da4fb;
      }
      puVar3 = (this->
               super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
               ).ptr;
      if (pAVar2 != (AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
                     *)puVar3) {
        lVar4 = 0;
        for (uVar5 = 0;
            uVar5 < (this->
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                    ).buffer_size; uVar5 = uVar5 + 1) {
          puVar3 = (this->
                   super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                   ).ptr;
          *(undefined8 *)(pAVar2->aligned_char + lVar4) =
               *(undefined8 *)
                ((long)&(puVar3->_M_t).
                        super___uniq_ptr_impl<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExtension_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                        .super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false> + lVar4
                );
          *(undefined8 *)
           ((long)&(puVar3->_M_t).
                   super___uniq_ptr_impl<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExtension_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                   .super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false> + lVar4) = 0
          ;
          std::
          unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
          ::~unique_ptr((unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                         *)((long)&(((this->
                                     super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                                     ).ptr)->_M_t).
                                   super___uniq_ptr_impl<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExtension_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
                                   .
                                   super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>
                           + lVar4));
          lVar4 = lVar4 + 8;
        }
        puVar3 = (this->
                 super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                 ).ptr;
      }
      if ((AlignedBuffer<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
           *)puVar3 != &this->stack_storage) {
        free(puVar3);
      }
      (this->
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
      ).ptr = (unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
               *)pAVar2;
      this->buffer_capacity = uVar1;
    }
    return;
  }
LAB_002da4fb:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}